

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_floating_abi_cxx11_
          (result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  bool bVar1;
  byte bVar2;
  type rollback;
  value_type *pvVar3;
  pair<double,_toml::detail::region> *v_00;
  pair<double,_toml::detail::region> *v_01;
  pair<double,_toml::detail::region> *v_02;
  pair<double,_toml::detail::region> *v_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_04;
  pair<double,_toml::detail::region> *v_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_06;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_998;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_938;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8b8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_89a;
  undefined1 local_899;
  source_location local_898;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_848;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_840;
  iterator local_7d0;
  size_type local_7c8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7c0;
  allocator<char> local_7a1;
  string local_7a0;
  string local_780;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_760;
  char *local_740;
  pair<double,_toml::detail::region> local_738;
  success<std::pair<double,_toml::detail::region>_> local_6e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_698;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_672;
  undefined1 local_671;
  source_location local_670;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_620;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_618;
  iterator local_5a8;
  size_type local_5a0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_598;
  allocator<char> local_579;
  string local_578;
  string local_558;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  char *local_518;
  double local_510;
  floating v;
  istringstream iss;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  undefined8 local_378;
  char local_369;
  char *local_368;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  undefined8 local_350;
  double local_348;
  pair<double,_toml::detail::region> local_340;
  success<std::pair<double,_toml::detail::region>_> local_2f0;
  double local_2a0;
  pair<double,_toml::detail::region> local_298;
  success<std::pair<double,_toml::detail::region>_> local_248;
  double local_1f8;
  pair<double,_toml::detail::region> local_1f0;
  success<std::pair<double,_toml::detail::region>_> local_1a0;
  int local_14c;
  double local_148;
  pair<double,_toml::detail::region> local_140;
  success<std::pair<double,_toml::detail::region>_> local_f0;
  undefined1 local_90 [8];
  string str;
  result<toml::detail::region,_toml::detail::none_t> token;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  location *loc_local;
  
  rollback = location::iter((location *)this);
  either<$e07b6a6f$>::invoke
            ((result<toml::detail::region,_toml::detail::none_t> *)((long)&str.field_2 + 8),
             (location *)this);
  bVar1 = toml::result::operator_cast_to_bool((result *)(str.field_2._M_local_buf + 8));
  if (bVar1) {
    pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)
                        ((long)&str.field_2 + 8));
    region::str_abi_cxx11_((string *)local_90,pvVar3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"inf");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"+inf"), bVar1)) {
      local_148 = std::numeric_limits<double>::infinity();
      pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                         ((result<toml::detail::region,_toml::detail::none_t> *)
                          ((long)&str.field_2 + 8));
      std::make_pair<double,toml::detail::region_const&>(&local_140,&local_148,pvVar3);
      ok<std::pair<double,toml::detail::region>>(&local_f0,(toml *)&local_140,v_00);
      result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_f0);
      success<std::pair<double,_toml::detail::region>_>::~success(&local_f0);
      std::pair<double,_toml::detail::region>::~pair(&local_140);
      local_14c = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"-inf");
      if (bVar1) {
        local_1f8 = std::numeric_limits<double>::infinity();
        local_1f8 = -local_1f8;
        pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                           ((result<toml::detail::region,_toml::detail::none_t> *)
                            ((long)&str.field_2 + 8));
        std::make_pair<double,toml::detail::region_const&>(&local_1f0,&local_1f8,pvVar3);
        ok<std::pair<double,toml::detail::region>>(&local_1a0,(toml *)&local_1f0,v_01);
        result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_1a0);
        success<std::pair<double,_toml::detail::region>_>::~success(&local_1a0);
        std::pair<double,_toml::detail::region>::~pair(&local_1f0);
        local_14c = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"nan");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_90,"+nan"), bVar1)) {
          local_2a0 = std::numeric_limits<double>::quiet_NaN();
          pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                             ((result<toml::detail::region,_toml::detail::none_t> *)
                              ((long)&str.field_2 + 8));
          std::make_pair<double,toml::detail::region_const&>(&local_298,&local_2a0,pvVar3);
          ok<std::pair<double,toml::detail::region>>(&local_248,(toml *)&local_298,v_02);
          result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::result(__return_storage_ptr__,&local_248);
          success<std::pair<double,_toml::detail::region>_>::~success(&local_248);
          std::pair<double,_toml::detail::region>::~pair(&local_298);
          local_14c = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,"-nan");
          if (bVar1) {
            local_348 = std::numeric_limits<double>::quiet_NaN();
            local_348 = -local_348;
            pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                               ((result<toml::detail::region,_toml::detail::none_t> *)
                                ((long)&str.field_2 + 8));
            std::make_pair<double,toml::detail::region_const&>(&local_340,&local_348,pvVar3);
            ok<std::pair<double,toml::detail::region>>(&local_2f0,(toml *)&local_340,v_03);
            result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::result(__return_storage_ptr__,&local_2f0);
            success<std::pair<double,_toml::detail::region>_>::~success(&local_2f0);
            std::pair<double,_toml::detail::region>::~pair(&local_340);
            local_14c = 1;
          }
          else {
            local_360._M_current = (char *)std::__cxx11::string::begin();
            local_368 = (char *)std::__cxx11::string::end();
            local_369 = '_';
            local_358 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                  (local_360,
                                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_368,&local_369);
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_350,&local_358)
            ;
            local_380._M_current = (char *)std::__cxx11::string::end();
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_378,&local_380)
            ;
            std::__cxx11::string::erase(local_90,local_350,local_378);
            std::__cxx11::istringstream::istringstream((istringstream *)&v,(string *)local_90,_S_in)
            ;
            local_510 = 0.0;
            std::istream::operator>>(&v,&local_510);
            bVar2 = std::ios::fail();
            if ((bVar2 & 1) == 0) {
              pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                                 ((result<toml::detail::region,_toml::detail::none_t> *)
                                  ((long)&str.field_2 + 8));
              std::make_pair<double&,toml::detail::region_const&>(&local_738,&local_510,pvVar3);
              ok<std::pair<double,toml::detail::region>>(&local_6e8,(toml *)&local_738,v_05);
              result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::result(__return_storage_ptr__,&local_6e8);
              success<std::pair<double,_toml::detail::region>_>::~success(&local_6e8);
              std::pair<double,_toml::detail::region>::~pair(&local_738);
            }
            else {
              local_518 = rollback._M_current;
              location::reset((location *)this,(const_iterator)rollback._M_current);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_578,"toml::parse_floating:",&local_579);
              local_671 = 1;
              local_620 = &local_618;
              source_location::source_location(&local_670,(location *)this);
              std::
              pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<toml::source_location,_const_char_(&)[13],_true>
                        (&local_618,&local_670,(char (*) [13])"out of range");
              local_671 = 0;
              local_5a8 = &local_618;
              local_5a0 = 1;
              std::
              allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::allocator(&local_672);
              __l_00._M_len = local_5a0;
              __l_00._M_array = local_5a8;
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector(&local_598,__l_00,&local_672);
              local_698.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_698.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_698.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_698);
              format_underline(&local_558,&local_578,&local_598,&local_698,false);
              err<std::__cxx11::string>(&local_538,(toml *)&local_558,v_04);
              result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::result(__return_storage_ptr__,&local_538);
              failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~failure(&local_538);
              std::__cxx11::string::~string((string *)&local_558);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_698);
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_598);
              std::
              allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~allocator(&local_672);
              local_938 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_5a8;
              do {
                local_938 = local_938 + -1;
                std::
                pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(local_938);
              } while (local_938 != &local_618);
              source_location::~source_location(&local_670);
              std::__cxx11::string::~string((string *)&local_578);
              std::allocator<char>::~allocator(&local_579);
            }
            local_14c = 1;
            std::__cxx11::istringstream::~istringstream((istringstream *)&v);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    local_14c = 0;
  }
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)((long)&str.field_2 + 8));
  if (local_14c == 0) {
    local_740 = rollback._M_current;
    location::reset((location *)this,(const_iterator)rollback._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a0,"toml::parse_floating: ",&local_7a1);
    local_899 = 1;
    local_848 = &local_840;
    source_location::source_location(&local_898,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[30],_true>
              (&local_840,&local_898,(char (*) [30])"the next token is not a float");
    local_899 = 0;
    local_7d0 = &local_840;
    local_7c8 = 1;
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_89a);
    __l._M_len = local_7c8;
    __l._M_array = local_7d0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_7c0,__l,&local_89a);
    local_8b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_8b8);
    format_underline(&local_780,&local_7a0,&local_7c0,&local_8b8,false);
    err<std::__cxx11::string>(&local_760,(toml *)&local_780,v_06);
    result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_760);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_760);
    std::__cxx11::string::~string((string *)&local_780);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8b8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_7c0);
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_89a);
    local_998 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_7d0;
    do {
      local_998 = local_998 + -1;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_998);
    } while (local_998 != &local_840);
    source_location::~source_location(&local_898);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator(&local_7a1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<floating, region>, std::string>
parse_floating(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_float::invoke(loc))
    {
        auto str = token.unwrap().str();
        if(str == "inf" || str == "+inf")
        {
            if(std::numeric_limits<floating>::has_infinity)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::infinity(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: inf value found"
                    " but the current environment does not support inf. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "-inf")
        {
            if(std::numeric_limits<floating>::has_infinity)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::infinity(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: inf value found"
                    " but the current environment does not support inf. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "nan" || str == "+nan")
        {
            if(std::numeric_limits<floating>::has_quiet_NaN)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::quiet_NaN(), token.unwrap()));
            }
            else if(std::numeric_limits<floating>::has_signaling_NaN)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::signaling_NaN(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: NaN value found"
                    " but the current environment does not support NaN. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "-nan")
        {
            if(std::numeric_limits<floating>::has_quiet_NaN)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::quiet_NaN(), token.unwrap()));
            }
            else if(std::numeric_limits<floating>::has_signaling_NaN)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::signaling_NaN(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: NaN value found"
                    " but the current environment does not support NaN. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());
        std::istringstream iss(str);
        floating v(0.0);
        iss >> v;
        if(iss.fail())
        {
            // see parse_octal_integer for detail of this error message.
            loc.reset(first);
            return err(format_underline("toml::parse_floating:",
                       {{source_location(loc), "out of range"}}));
        }
        return ok(std::make_pair(v, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("toml::parse_floating: ",
               {{source_location(loc), "the next token is not a float"}}));
}